

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  value_type vVar4;
  long lVar5;
  uint uVar6;
  value_type *pvVar7;
  size_t sVar8;
  value_type vVar9;
  value_type *pvVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  value_type avStack_15 [13];
  
  uVar6 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  lVar5 = (long)iVar1;
  pvVar10 = avStack_15 + lVar5;
  uVar12 = uVar6;
  if (99 < uVar6) {
    do {
      uVar12 = uVar6 / 100;
      *(undefined2 *)(pvVar10 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar6 % 100) * 2);
      pvVar10 = pvVar10 + -2;
      bVar3 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar3);
  }
  pvVar7 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar8 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar9 = it->blackhole_;
  if (uVar12 < 10) {
    bVar11 = (byte)uVar12 | 0x30;
    lVar13 = -1;
  }
  else {
    pvVar10[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar12 * 2 & 0xffffffff) + 1];
    bVar11 = internal::basic_data<void>::DIGITS[(ulong)uVar12 * 2];
    lVar13 = -2;
  }
  pvVar10[lVar13] = bVar11;
  if (0 < iVar1) {
    lVar13 = 0;
    do {
      vVar4 = avStack_15[lVar13];
      if (sVar8 + lVar13 < uVar2) {
        *pvVar7 = avStack_15[lVar13];
        pvVar7 = pvVar7 + 1;
        vVar4 = vVar9;
      }
      vVar9 = vVar4;
      lVar13 = lVar13 + 1;
    } while (lVar5 != lVar13);
    sVar8 = sVar8 + lVar5;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar7;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar8;
  it->blackhole_ = vVar9;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }